

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void runMoira(Setup *s,Result *r)

{
  DasmNumberFormat value;
  DasmNumberFormat value_00;
  u16 uVar1;
  u32 uVar2;
  int iVar3;
  clock_t cVar4;
  clock_t cVar5;
  i64 iVar6;
  i64 iVar7;
  clock_t elapsed_1;
  int64_t cycles;
  u16 op;
  u32 pc;
  undefined5 uStack_35;
  clock_t elapsed;
  undefined5 uStack_1d;
  Result *r_local;
  Setup *s_local;
  
  uVar2 = moira::Moira::getPC(&moiracpu->super_Moira);
  r->oldpc = uVar2;
  uVar1 = get16(moiraMem,r->oldpc);
  r->opcode = uVar1;
  r->elapsed[1] = 0;
  r->elapsed[0] = 0;
  moira::Moira::setDasmSyntax(&moiracpu->super_Moira,MUSASHI);
  value_00.radix = 0x10;
  value_00.prefix = "$";
  value_00.upperCase = false;
  value_00.plainZero = false;
  value_00._11_5_ = uStack_1d;
  moira::Moira::setDasmNumberFormat(&moiracpu->super_Moira,value_00);
  cVar4 = clock();
  iVar3 = moira::Moira::disassemble(&moiracpu->super_Moira,r->dasmMusashi,r->oldpc);
  r->dasmCntMusashi = iVar3;
  cVar5 = clock();
  r->elapsed[1] = cVar5 - cVar4;
  moira::Moira::setDasmSyntax(&moiracpu->super_Moira,GNU);
  value.radix = 10;
  value.prefix = "$";
  value.upperCase = false;
  value.plainZero = true;
  value._11_5_ = uStack_35;
  moira::Moira::setDasmNumberFormat(&moiracpu->super_Moira,value);
  iVar3 = moira::Moira::disassemble(&moiracpu->super_Moira,r->dasmBinutils,r->oldpc);
  r->dasmCntBinutils = iVar3;
  if (r->opcode < 0xf000) {
    uVar2 = moira::Moira::getPC(&moiracpu->super_Moira);
    uVar1 = get16(moiraMem,uVar2);
    iVar6 = moira::Moira::getClock(&moiracpu->super_Moira);
    cVar4 = clock();
    moira::Moira::execute(&moiracpu->super_Moira);
    cVar5 = clock();
    r->elapsed[0] = cVar5 - cVar4;
    iVar7 = moira::Moira::getClock(&moiracpu->super_Moira);
    r->cycles = (int)iVar7 - (int)iVar6;
    r->oldpc = uVar2;
    r->opcode = uVar1;
    recordMoiraRegisters(r);
  }
  return;
}

Assistant:

void runMoira(Setup &s, Result &r)
{
    r.oldpc = moiracpu->getPC();
    r.opcode = get16(moiraMem, r.oldpc);
    r.elapsed[0] = r.elapsed[1] = 0;

    // Disassemble the instruction
    if (doDasm(r.opcode)) {

        // Disassemble the instruction in Musashi format
        moiracpu->setDasmSyntax(Syntax::MUSASHI);
        moiracpu->setDasmNumberFormat({ .prefix = "$", .radix = 16 });
        clock_t elapsed = clock();
        r.dasmCntMusashi = moiracpu->disassemble(r.dasmMusashi, r.oldpc);
        r.elapsed[1] = clock() - elapsed;

        // Disassemble the instruction in GNU format (binutils)
#ifdef MOTOROLA
        moiracpu->setDasmSyntax(Syntax::GNU);
#else
        moiracpu->setDasmSyntax(Syntax::GNU_MIT);
#endif
        moiracpu->setDasmNumberFormat({ .prefix = "$", .radix = 10, .plainZero = true });
        r.dasmCntBinutils = moiracpu->disassemble(r.dasmBinutils, r.oldpc);
    }

    // Run the Moira CPU
    if (doExec(r.opcode)) {

        u32 pc = moiracpu->getPC();
        u16 op = get16(moiraMem, pc);

        int64_t cycles = moiracpu->getClock();

        if (VERBOSE)
            printf("$%04x ($%04x): %s (Moira)\n", r.oldpc, r.opcode, r.dasmMusashi);

        // Execute instruction
        clock_t elapsed = clock();
        moiracpu->execute();
        r.elapsed[0] = clock() - elapsed;

        // Record the result
        r.cycles = (int)(moiracpu->getClock() - cycles);
        r.oldpc = pc;
        r.opcode = op;
        recordMoiraRegisters(r);
    }
}